

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O3

void __thiscall
flatbuffers::lobster::LobsterGenerator::CheckNameSpace
          (LobsterGenerator *this,Definition *def,string *code_ptr)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  _Alloc_hider _Var4;
  string ns;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  BaseGenerator::GetNameSpace_abi_cxx11_(&local_80,&this->super_BaseGenerator,def);
  _Var4._M_p = local_80._M_dataplus._M_p;
  if ((local_80._M_string_length != (this->current_namespace_)._M_string_length) ||
     ((local_80._M_string_length != 0 &&
      (iVar1 = bcmp(local_80._M_dataplus._M_p,(this->current_namespace_)._M_dataplus._M_p,
                    local_80._M_string_length), iVar1 != 0)))) {
    std::__cxx11::string::_M_assign((string *)&this->current_namespace_);
    std::operator+(&local_40,"namespace ",&local_80);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar3;
      local_60 = (long *)*plVar2;
    }
    local_58 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    _Var4._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      _Var4._M_p = local_80._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != &local_80.field_2) {
    operator_delete(_Var4._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CheckNameSpace(const Definition &def, std::string *code_ptr) {
    auto ns = GetNameSpace(def);
    if (ns == current_namespace_) return;
    current_namespace_ = ns;
    std::string &code = *code_ptr;
    code += "namespace " + ns + "\n\n";
  }